

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Int128 Omega_h::int128_sum(Reals *a,double unit)

{
  Alloc *pAVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  Int128 IVar8;
  type transform;
  Write<double> local_48;
  double local_38;
  Write<double> local_30;
  double local_20;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar5 = pAVar1->size;
    if ((int)(uVar5 >> 3) != 0) {
LAB_0022307e:
      Write<double>::Write(&local_48,&a->write_);
      entering_parallel = 1;
      local_38 = unit;
      Write<double>::Write(&local_30,&local_48);
      local_20 = local_38;
      entering_parallel = 0;
      lVar3 = 0;
      uVar6 = 0;
      for (lVar2 = 0; (int)(uVar5 >> 3) != lVar2; lVar2 = lVar2 + 1) {
        uVar4 = (ulong)(*(double *)((long)local_30.shared_alloc_.direct_ptr + lVar2 * 8) / local_38)
        ;
        bVar7 = CARRY8(uVar6,uVar4);
        uVar6 = uVar6 + uVar4;
        lVar3 = lVar3 + ((long)uVar4 >> 0x3f) + (ulong)bVar7;
      }
      Write<double>::~Write(&local_30);
      Write<double>::~Write(&local_48);
      goto LAB_00223117;
    }
  }
  else if ((int)((ulong)pAVar1 >> 6) != 0) {
    uVar5 = (ulong)pAVar1 >> 3;
    goto LAB_0022307e;
  }
  lVar3 = 0;
  uVar6 = 0;
LAB_00223117:
  IVar8.low = uVar6;
  IVar8.high = lVar3;
  return IVar8;
}

Assistant:

Int128 int128_sum(Reals const a, double const unit) {
  if (a.size() == 0) {
    return Int128(0);
  }
  auto const first = IntIterator(0);
  auto const last = IntIterator(a.size());
  auto const init = Int128(0);
  auto const op = Int128Plus();
  auto transform = OMEGA_H_LAMBDA(LO i)->Int128 {
    return Int128::from_double(a[i], unit);
  };
  return transform_reduce(first, last, init, op, std::move(transform));
}